

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O0

If_LibBox_t * If_LibBoxRead2(char *pFileName)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *__s;
  char *pcVar3;
  char *pcVar4;
  int local_70;
  int local_6c;
  int local_68;
  int nPos;
  int nPis;
  int Id;
  int i;
  int fOuter;
  int fBlack;
  int fSeq;
  char *pName;
  char *pToken;
  If_Box_t *pBox;
  If_LibBox_t *p;
  FILE *pFile;
  char *pBuffer;
  int nSize;
  char *pFileName_local;
  
  pBox = (If_Box_t *)0x0;
  pToken = (char *)0x0;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    local_6c = 0;
    local_68 = 0;
    __s = (char *)malloc(100000);
    while (pcVar3 = fgets(__s,100000,__stream), pcVar3 != (char *)0x0) {
      pName = strtok(__s," \n\r\t");
      if (pName != (char *)0x0) {
        if (*pName == '.') {
          iVar1 = strcmp(pName,".box");
          if (iVar1 == 0) {
            pcVar3 = strtok((char *)0x0," \n\r\t");
            iVar1 = atoi(pcVar3);
            pcVar3 = strtok((char *)0x0," \n\r\t");
            pcVar3 = Abc_UtilStrsav(pcVar3);
            pcVar4 = strtok((char *)0x0," \n\r\t");
            local_68 = atoi(pcVar4);
            pcVar4 = strtok((char *)0x0," \n\r\t");
            local_6c = atoi(pcVar4);
            Id = 0;
            i = 0;
            fOuter = 0;
            pName = strtok((char *)0x0," \n\r\t");
            while (pName != (char *)0x0) {
              iVar2 = strcmp(pName,"seq");
              if (iVar2 == 0) {
                fOuter = 1;
              }
              else {
                iVar2 = strcmp(pName,"black");
                if (iVar2 == 0) {
                  i = 1;
                }
                else {
                  iVar2 = strcmp(pName,"outer");
                  if (iVar2 == 0) {
                    Id = 1;
                  }
                  else {
                    iVar2 = strcmp(pName,"comb");
                    if (((iVar2 != 0) && (iVar2 = strcmp(pName,"white"), iVar2 != 0)) &&
                       (iVar2 = strcmp(pName,"inner"), iVar2 != 0)) {
                      __assert_fail("!strcmp(pToken, \"comb\") || !strcmp(pToken, \"white\") || !strcmp(pToken, \"inner\")"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifLibBox.c"
                                    ,0xd3,"If_LibBox_t *If_LibBoxRead2(char *)");
                    }
                  }
                }
              }
              pName = strtok((char *)0x0," \n\r\t");
            }
            if (pBox == (If_Box_t *)0x0) {
              pBox = (If_Box_t *)If_LibBoxStart();
            }
            pToken = (char *)If_BoxStart(pcVar3,iVar1,local_68,local_6c,fOuter,i,Id);
            If_LibBoxAdd((If_LibBox_t *)pBox,(If_Box_t *)pToken);
          }
        }
        else {
          if ((local_68 < 1) || (local_6c < 1)) {
            __assert_fail("nPis > 0 && nPos > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifLibBox.c"
                          ,0xe0,"If_LibBox_t *If_LibBoxRead2(char *)");
          }
          for (nPis = 0; nPis < local_68 * local_6c; nPis = nPis + 1) {
            while (pName == (char *)0x0) {
              pcVar3 = fgets(__s,100000,__stream);
              if (pcVar3 == (char *)0x0) {
                printf("The table does not have enough entries.\n");
                fflush(_stdout);
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifLibBox.c"
                              ,0xe6,"If_LibBox_t *If_LibBoxRead2(char *)");
              }
              pName = strtok(__s," \n\r\t");
            }
            if (*pName == '-') {
              local_70 = -1;
            }
            else {
              local_70 = atoi(pName);
            }
            *(int *)(*(long *)(pToken + 0x18) + (long)nPis * 4) = local_70;
            pName = strtok((char *)0x0," \n\r\t");
          }
          pToken = (char *)0x0;
        }
      }
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
    fclose(__stream);
    pFileName_local = (char *)pBox;
  }
  return (If_LibBox_t *)pFileName_local;
}

Assistant:

If_LibBox_t * If_LibBoxRead2( char * pFileName )
{
    int nSize = 100000;
    char * pBuffer;
    FILE * pFile;
    If_LibBox_t * p = NULL;
    If_Box_t * pBox = NULL;
    char * pToken, * pName;
    int fSeq, fBlack, fOuter;
    int i, Id, nPis, nPos;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    // read lines
    nPis = nPos = 0;
    pBuffer = ABC_ALLOC( char, nSize );
    while ( fgets( pBuffer, nSize, pFile ) )
    {
        pToken = strtok( pBuffer, " \n\r\t" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '.' )
        {
            if ( !strcmp(pToken, ".box") )
            {
                // save ID
                pToken = strtok( NULL, " \n\r\t" );
                Id     = atoi( pToken );
                // save name
                pToken = strtok( NULL, " \n\r\t" );
                pName  = Abc_UtilStrsav(pToken);
                // save PIs
                pToken = strtok( NULL, " \n\r\t" );
                nPis   = atoi( pToken );
                // save POs
                pToken = strtok( NULL, " \n\r\t" );
                nPos   = atoi( pToken );
                // save attributes
                fSeq = fBlack = fOuter = 0;
                pToken = strtok( NULL, " \n\r\t" );
                while ( pToken )
                {
                    if ( !strcmp(pToken, "seq") )
                        fSeq = 1;
                    else if ( !strcmp(pToken, "black") )
                        fBlack = 1;
                    else if ( !strcmp(pToken, "outer") )
                        fOuter = 1;
                    else assert( !strcmp(pToken, "comb") || !strcmp(pToken, "white") || !strcmp(pToken, "inner") );
                    pToken = strtok( NULL, " \n\r\t" );
                }
                // create library
                if ( p == NULL )
                    p = If_LibBoxStart();
                // create box
                pBox = If_BoxStart( pName, Id, nPis, nPos, fSeq, fBlack, fOuter );
                If_LibBoxAdd( p, pBox );
            }
            continue;
        }
        // read the table
        assert( nPis > 0 && nPos > 0 );
        for ( i = 0; i < nPis * nPos; i++ )
        {
            while ( pToken == NULL )
            {
                if ( fgets( pBuffer, nSize, pFile ) == NULL )
                { printf( "The table does not have enough entries.\n" ); fflush(stdout); assert( 0 ); }
                pToken = strtok( pBuffer, " \n\r\t" );
            }
            pBox->pDelays[i] = (pToken[0] == '-') ? -1 : atoi(pToken);
            pToken = strtok( NULL, " \n\r\t" );
        }
        pBox = NULL;
    }
    ABC_FREE( pBuffer );
    fclose( pFile );
    return p;
}